

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

float pbrt::findCameraFov(SP *camera)

{
  element_type *peVar1;
  undefined8 uVar2;
  float fVar3;
  long *local_48 [2];
  long local_38 [2];
  undefined1 local_28 [16];
  
  peVar1 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"fov","");
  syntactic::ParamSet::findParam<float>
            ((ParamSet *)local_28,(string *)&(peVar1->super_Node).super_ParamSet);
  uVar2 = local_28._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (uVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "warning - pbrt file has camera, but camera has no \'fov\' field; replacing with constant 30 degrees"
               ,0x61);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    fVar3 = 30.0;
  }
  else {
    peVar1 = (camera->super___shared_ptr<pbrt::syntactic::Camera,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"fov","");
    syntactic::ParamSet::findParam<float>
              ((ParamSet *)local_28,(string *)&(peVar1->super_Node).super_ParamSet);
    fVar3 = **(float **)(local_28._0_8_ + 0x18);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return fVar3;
}

Assistant:

float findCameraFov(pbrt::syntactic::Camera::SP camera)
  {
    if (!camera->findParam<float>("fov")) {
      std::cerr << "warning - pbrt file has camera, but camera has no 'fov' field; replacing with constant 30 degrees" << std::endl;
      return 30;
    }
    return camera->findParam<float>("fov")->get(0);
  }